

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

_Bool obj_is_useable(object *obj)

{
  _Bool _Var1;
  effect *peVar2;
  object *obj_local;
  
  _Var1 = tval_is_useable(obj);
  if (_Var1) {
    obj_local._7_1_ = true;
  }
  else {
    peVar2 = object_effect(obj);
    if (peVar2 == (effect *)0x0) {
      _Var1 = tval_is_ammo(obj);
      if (_Var1) {
        obj_local._7_1_ = (uint)obj->tval == (player->state).ammo_tval;
      }
      else {
        obj_local._7_1_ = false;
      }
    }
    else {
      obj_local._7_1_ = true;
    }
  }
  return obj_local._7_1_;
}

Assistant:

bool obj_is_useable(const struct object *obj)
{
	if (tval_is_useable(obj))
		return true;

	if (object_effect(obj))
		return true;

	if (tval_is_ammo(obj))
		return obj->tval == player->state.ammo_tval;

	return false;
}